

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.cpp
# Opt level: O0

PsbtGlobalRequestDataStruct * __thiscall
cfd::js::api::json::PsbtGlobalRequestData::ConvertToStruct
          (PsbtGlobalRequestDataStruct *__return_storage_ptr__,PsbtGlobalRequestData *this)

{
  vector<cfd::js::api::PsbtMapDataStruct,_std::allocator<cfd::js::api::PsbtMapDataStruct>_> local_60
  ;
  vector<cfd::js::api::PsbtGlobalXpubInputStruct,_std::allocator<cfd::js::api::PsbtGlobalXpubInputStruct>_>
  local_38;
  undefined1 local_19;
  PsbtGlobalRequestData *local_18;
  PsbtGlobalRequestData *this_local;
  PsbtGlobalRequestDataStruct *result;
  
  local_19 = 0;
  local_18 = this;
  this_local = (PsbtGlobalRequestData *)__return_storage_ptr__;
  PsbtGlobalRequestDataStruct::PsbtGlobalRequestDataStruct(__return_storage_ptr__);
  core::
  JsonObjectVector<cfd::js::api::json::PsbtGlobalXpubInput,_cfd::js::api::PsbtGlobalXpubInputStruct>
  ::ConvertToStruct(&local_38,&this->xpubs_);
  std::
  vector<cfd::js::api::PsbtGlobalXpubInputStruct,_std::allocator<cfd::js::api::PsbtGlobalXpubInputStruct>_>
  ::operator=(&__return_storage_ptr__->xpubs,&local_38);
  std::
  vector<cfd::js::api::PsbtGlobalXpubInputStruct,_std::allocator<cfd::js::api::PsbtGlobalXpubInputStruct>_>
  ::~vector(&local_38);
  core::JsonObjectVector<cfd::js::api::json::PsbtMapData,_cfd::js::api::PsbtMapDataStruct>::
  ConvertToStruct(&local_60,&this->unknown_);
  std::vector<cfd::js::api::PsbtMapDataStruct,_std::allocator<cfd::js::api::PsbtMapDataStruct>_>::
  operator=(&__return_storage_ptr__->unknown,&local_60);
  std::vector<cfd::js::api::PsbtMapDataStruct,_std::allocator<cfd::js::api::PsbtMapDataStruct>_>::
  ~vector(&local_60);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&__return_storage_ptr__->ignore_items,&this->ignore_items);
  return __return_storage_ptr__;
}

Assistant:

PsbtGlobalRequestDataStruct PsbtGlobalRequestData::ConvertToStruct() const {  // NOLINT
  PsbtGlobalRequestDataStruct result;
  result.xpubs = xpubs_.ConvertToStruct();
  result.unknown = unknown_.ConvertToStruct();
  result.ignore_items = ignore_items;
  return result;
}